

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_decoder_isac_t_impl.h
# Opt level: O0

void __thiscall
webrtc::AudioDecoderIsacT<webrtc::IsacFloat>::~AudioDecoderIsacT
          (AudioDecoderIsacT<webrtc::IsacFloat> *this)

{
  FatalMessage local_198;
  int16_t local_1e;
  int local_1c;
  string *local_18;
  string *_result;
  AudioDecoderIsacT<webrtc::IsacFloat> *this_local;
  
  local_1c = 0;
  _result = (string *)this;
  local_1e = IsacFloat::Free(this->isac_state_);
  local_18 = rtc::CheckEQImpl<int,short>(&local_1c,&local_1e,"0 == T::Free(isac_state_)");
  if (local_18 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_decoder_isac_t_impl.h"
               ,0x27,local_18);
    rtc::FatalMessage::stream(&local_198);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  rtc::scoped_refptr<webrtc::LockedIsacBandwidthInfo>::~scoped_refptr(&this->bwinfo_);
  AudioDecoder::~AudioDecoder(&this->super_AudioDecoder);
  return;
}

Assistant:

AudioDecoderIsacT<T>::~AudioDecoderIsacT() {
  RTC_CHECK_EQ(0, T::Free(isac_state_));
}